

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

FuncflParameters * __thiscall OpenMD::EAMAdapter::getFuncflParam(EAMAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  FuncflParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> funcflData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff18;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  errorStruct *peVar3;
  AtomType *in_stack_ffffffffffffff38;
  errorStruct *in_stack_ffffffffffffff40;
  string local_a0 [64];
  undefined1 local_60 [96];
  
  bVar1 = isEAM((EAMAdapter *)0x2965b6);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getFuncflParam was passed an atomType (%s)\n\tthat does not appear to be an EAM atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff40 = &painCave;
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getFuncflParam could not find Funcfl\n\tparameters for atomType %s.\n",
             uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff40->severity = 1;
    in_stack_ffffffffffffff40->isFatal = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getFuncflParam could not convert\n\tGenericData to FuncflData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar3->severity = 1;
    peVar3->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2967b1);
  SimpleTypeData<OpenMD::FuncflParameters>::getData(this_00);
  FuncflParameters::FuncflParameters
            ((FuncflParameters *)in_stack_ffffffffffffff40,
             (FuncflParameters *)in_stack_ffffffffffffff38);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)0x2967db);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2967e8);
  return in_RDI;
}

Assistant:

FuncflParameters EAMAdapter::getFuncflParam() {
    if (!isEAM()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam was passed an atomType (%s)\n"
               "\tthat does not appear to be an EAM atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FuncflTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam could not find Funcfl\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FuncflData> funcflData =
        std::dynamic_pointer_cast<FuncflData>(data);
    if (funcflData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getFuncflParam could not convert\n"
               "\tGenericData to FuncflData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return funcflData->getData();
  }